

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Variables.cpp
# Opt level: O1

void __thiscall Refal2::CVariablesBuilder::Reset(CVariablesBuilder *this)

{
  CQualifier *this_00;
  long lVar1;
  
  if (0 < this->firstFreeVariableIndex) {
    this_00 = &this->variables[0].Qualifier;
    lVar1 = 0;
    do {
      CQualifier::Empty(this_00);
      lVar1 = lVar1 + 1;
      this_00 = (CQualifier *)(this_00[1].ansichars.super__Base_bitset<2UL>._M_w + 1);
    } while (lVar1 < this->firstFreeVariableIndex);
  }
  this->firstFreeVariableIndex = 0;
  memset(&(this->super_CErrorsHelper).field_0xa4,0xff,0x400);
  return;
}

Assistant:

void CVariablesBuilder::Reset()
{
	for( int i = 0; i < firstFreeVariableIndex; i++ ) {
		variables[i].Qualifier.Empty();
	}
	firstFreeVariableIndex = 0;
	for( int i = 0; i < VariableNameToIndexSize; i++ ) {
		variableNameToIndex[i] = InvalidVariableIndex;
	}
}